

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckForListElements(TidyDocImpl *doc,Node *node)

{
  Node *local_18;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_LI)) {
    if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_OL)) ||
       (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_UL)))) {
      (doc->access).OtherListElements = (doc->access).OtherListElements + 1;
    }
  }
  else {
    (doc->access).ListElements = (doc->access).ListElements + 1;
  }
  for (local_18 = node->content; local_18 != (Node *)0x0; local_18 = local_18->next) {
    CheckForListElements(doc,local_18);
  }
  return;
}

Assistant:

static void CheckForListElements( TidyDocImpl* doc, Node* node )
{
    if ( nodeIsLI(node) )
    {
        doc->access.ListElements++;
    }
    else if ( nodeIsOL(node) || nodeIsUL(node) )
    {
        doc->access.OtherListElements++;
    }

    for ( node = node->content; node != NULL; node = node->next )
    {
        CheckForListElements( doc, node );
    }
}